

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

Value * __thiscall
Json::Path::resolve(Value *__return_storage_ptr__,Path *this,Value *root,Value *defaultValue)

{
  uint uVar1;
  ArrayIndex AVar2;
  PathArgument *arg;
  pointer key;
  Value *pVVar3;
  
  for (key = (this->args_).
             super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
             super__Vector_impl_data._M_start; pVVar3 = root,
      key != (this->args_).
             super__Vector_base<Json::PathArgument,_std::allocator<Json::PathArgument>_>._M_impl.
             super__Vector_impl_data._M_finish; key = key + 1) {
    pVVar3 = defaultValue;
    if (key->kind_ == kindKey) {
      if ((root->field_0x8 != '\a') ||
         (root = Value::operator[](root,&key->key_), root == (Value *)kNull)) break;
    }
    else if (key->kind_ == kindIndex) {
      if ((root->field_0x8 != '\x06') ||
         (uVar1 = key->index_, AVar2 = Value::size(root), AVar2 <= uVar1)) break;
      root = Value::operator[](root,key->index_);
    }
  }
  Value::Value(__return_storage_ptr__,pVVar3);
  return __return_storage_ptr__;
}

Assistant:

Value Path::resolve(const Value& root, const Value& defaultValue) const {
  const Value* node = &root;
  for (Args::const_iterator it = args_.begin(); it != args_.end(); ++it) {
    const PathArgument& arg = *it;
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_))
        return defaultValue;
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject())
        return defaultValue;
      node = &((*node)[arg.key_]);
      if (node == &Value::nullRef)
        return defaultValue;
    }
  }
  return *node;
}